

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ImGuiWindow *window_1;
  ImDrawList *this;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  int iVar12;
  ImDrawCmd *pIVar13;
  ImVec4 *buf_00;
  int iVar14;
  long lVar15;
  uint *puVar16;
  ImGuiContext *pIVar17;
  undefined4 uVar18;
  float fVar19;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char texid_desc [20];
  char buf [300];
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  void *pvStack_1e0;
  ImDrawCmd *local_1d0;
  ImGuiContext *local_1c8;
  ImDrawList *local_1c0;
  long local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8 [4];
  char local_188 [32];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pIVar17 = GImGui;
  iVar14 = (draw_list->CmdBuffer).Size;
  lVar15 = (long)iVar14;
  if ((0 < lVar15) && (pIVar13 = (draw_list->CmdBuffer).Data, pIVar13[lVar15 + -1].ElemCount == 0))
  {
    iVar14 = iVar14 - (uint)(pIVar13[lVar15 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  pcVar11 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar11 = draw_list->_OwnerName;
  }
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar11,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar14);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar5) {
      return;
    }
  }
  else {
    this = GetViewportBgFgDrawList(*(pIVar4->Viewports).Data,1,"##Foreground");
    if ((window != (ImGuiWindow *)0x0) &&
       (bVar6 = IsItemHovered(0), this != (ImDrawList *)0x0 && bVar6)) {
      local_168[0].y = (window->Size).y + (window->Pos).y;
      local_168[0].x = (window->Size).x + (window->Pos).x;
      ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0,1.0);
    }
    if (!bVar5) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < iVar14) {
      pIVar13 = (draw_list->CmdBuffer).Data;
      local_1b8 = (long)iVar14 * 0x38;
      local_1c8 = pIVar17;
      local_1c0 = draw_list;
      do {
        if (pIVar13->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString(local_188,0x14,"0x%p",pIVar13->TextureId);
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar13->ClipRect).x,0),
                         SUB84((double)(pIVar13->ClipRect).y,0),(double)(pIVar13->ClipRect).z,
                         (double)(pIVar13->ClipRect).w,(ulong)pIVar13->ElemCount / 3,local_188);
          bVar5 = TreeNode((void *)(((long)pIVar13 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            bVar6 = (pIVar17->DebugMetricsConfig).ShowDrawCmdMesh;
            if (bVar6 == false) {
              if ((this != (ImDrawList *)0x0) &&
                 ((pIVar17->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false))
              goto LAB_001983c1;
            }
            else if (this != (ImDrawList *)0x0) {
LAB_001983c1:
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (this,draw_list,pIVar13,bVar6,
                         (pIVar17->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
            }
          }
          if (bVar5) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar16 = (uint *)0x0;
            }
            else {
              puVar16 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar13->VtxOffset;
            uVar7 = pIVar13->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar10 = pIVar13->ElemCount;
            uVar18 = 0;
            if (uVar7 < uVar10 + uVar7) {
              fVar19 = 0.0;
              do {
                local_208._0_4_ = 0.0;
                local_208._4_4_ = 0.0;
                uStack_200._0_4_ = 0.0;
                uStack_200._4_4_ = 0.0;
                local_1f8._0_4_ = 0.0;
                local_1f8._4_4_ = 0.0;
                lVar15 = 0;
                do {
                  uVar10 = (uint)((ulong)uVar7 + lVar15);
                  if (puVar16 != (uint *)0x0) {
                    uVar10 = puVar16[(ulong)uVar7 + lVar15 & 0xffffffff];
                  }
                  *(ImVec2 *)(local_208 + lVar15 * 8) = pIVar3[(ulong)uVar1 + (ulong)uVar10].pos;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                fVar19 = fVar19 + ABS(((float)local_208._4_4_ - uStack_200._4_4_) * (float)local_1f8
                                      + (uStack_200._4_4_ - local_1f8._4_4_) *
                                        (float)local_208._0_4_ +
                                        (local_1f8._4_4_ - (float)local_208._4_4_) *
                                        (float)uStack_200) * 0.5;
                uVar10 = pIVar13->ElemCount;
                uVar7 = uVar7 + 3;
              } while (uVar7 < uVar10 + pIVar13->IdxOffset);
              uVar18 = SUB84((double)fVar19,0);
              uVar7 = pIVar13->IdxOffset;
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar18,(ulong)uVar10,(ulong)pIVar13->VtxOffset,(ulong)uVar7);
            local_208._0_4_ = 0.0;
            local_208._4_4_ = 0.0;
            Selectable((char *)local_168,false,0,(ImVec2 *)local_208);
            bVar5 = IsItemHovered(0);
            if (this != (ImDrawList *)0x0 && bVar5) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar13,true,false);
            }
            local_1e8 = 0.0;
            pvStack_1e0 = (void *)0x0;
            local_1f8._0_4_ = 0.0;
            local_1f8._4_4_ = 0.0;
            uStack_1f0._0_4_ = 0.0;
            uStack_1f0._4_4_ = 0;
            local_208._0_4_ = 0.0;
            local_208._4_4_ = 0.0;
            uStack_200._0_4_ = 0.0;
            uStack_200._4_4_ = 0.0;
            local_1d0 = pIVar13;
            ImGuiListClipper::Begin((ImGuiListClipper *)local_208,pIVar13->ElemCount / 3,-1.0);
            while (bVar5 = ImGuiListClipper::Step((ImGuiListClipper *)local_208), bVar5) {
              if ((int)(float)uStack_200 < (int)uStack_200._4_4_) {
                iVar12 = (int)(float)uStack_200 * 3 + local_1d0->IdxOffset;
                iVar14 = (int)(float)uStack_200;
                do {
                  local_1a8[0].x = 0.0;
                  local_1a8[0].y = 0.0;
                  local_1a8[1].x = 0.0;
                  local_1a8[1].y = 0.0;
                  local_1a8[2].x = 0.0;
                  local_1a8[2].y = 0.0;
                  lVar15 = 0;
                  buf_00 = local_168;
                  do {
                    if (puVar16 == (uint *)0x0) {
                      uVar7 = iVar12 + (int)lVar15;
                    }
                    else {
                      uVar7 = puVar16[iVar12 + lVar15];
                    }
                    uVar9 = (ulong)uVar7;
                    local_1a8[lVar15] = pIVar3[uVar1 + uVar9].pos;
                    pcVar11 = "     ";
                    if (lVar15 == 0) {
                      pcVar11 = "Vert:";
                    }
                    iVar8 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           SUB84((double)pIVar3[uVar1 + uVar9].pos.x,0),
                                           SUB84((double)pIVar3[uVar1 + uVar9].pos.y,0),
                                           (double)pIVar3[uVar1 + uVar9].uv.x,
                                           (double)pIVar3[uVar1 + uVar9].uv.y,pcVar11,
                                           (ulong)(uint)(iVar12 + (int)lVar15),
                                           (ulong)pIVar3[uVar1 + uVar9].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar8);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_1b0.x = 0.0;
                  local_1b0.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_1b0);
                  if ((this != (ImDrawList *)0x0) && (bVar5 = IsItemHovered(0), bVar5)) {
                    uVar7 = this->Flags;
                    this->Flags = uVar7 & 0xfffffffe;
                    ImDrawList::AddPolyline(this,local_1a8,3,0xff00ffff,1,1.0);
                    this->Flags = uVar7;
                  }
                  iVar12 = iVar12 + 3;
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uStack_200._4_4_);
              }
            }
            TreePop();
            ImGuiListClipper::End((ImGuiListClipper *)local_208);
            pIVar13 = local_1d0;
            draw_list = local_1c0;
            pIVar17 = local_1c8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar13->UserCallback,pIVar13->UserCallbackData);
        }
        pIVar13 = pIVar13 + 1;
      } while (pIVar13 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1b8));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(viewport); // Used in docking branch
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered() && fg_draw_list)
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char texid_desc[20];
        FormatTextureIDForDebugDisplay(texid_desc, IM_ARRAYSIZE(texid_desc), pcmd->TextureId);
        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, texid_desc, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}